

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_iflist.c
# Opt level: O0

csp_iface_t * csp_iflist_get_by_name(char *name)

{
  int iVar1;
  char *in_RDI;
  csp_iface_t *ifc;
  csp_iface_t *local_18;
  
  local_18 = interfaces;
  while( true ) {
    if (local_18 == (csp_iface_t *)0x0) {
      return (csp_iface_t *)0x0;
    }
    iVar1 = strncmp(local_18->name,in_RDI,10);
    if (iVar1 == 0) break;
    local_18 = local_18->next;
  }
  return local_18;
}

Assistant:

csp_iface_t * csp_iflist_get_by_name(const char * name) {
	csp_iface_t * ifc = interfaces;
	while (ifc) {
		if (strncmp(ifc->name, name, CSP_IFLIST_NAME_MAX) == 0) {
			return ifc;
		}
		ifc = ifc->next;
	}
	return NULL;
}